

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_functions.cpp
# Opt level: O1

Value * duckdb::ScalarFunctionExtractor::ResultType
                  (Value *__return_storage_ptr__,ScalarFunctionCatalogEntry *entry,idx_t offset)

{
  ScalarFunction local_138;
  
  FunctionSet<duckdb::ScalarFunction>::GetFunctionByOffset
            (&local_138,&(entry->functions).super_FunctionSet<duckdb::ScalarFunction>,offset);
  FunctionStabilityToValue(__return_storage_ptr__,local_138.super_BaseScalarFunction.stability);
  local_138.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_0247e7f0;
  if (local_138.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_138.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_138.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_138.function.super__Function_base._M_manager)
              ((_Any_data *)&local_138.function,(_Any_data *)&local_138.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_138.super_BaseScalarFunction);
  return __return_storage_ptr__;
}

Assistant:

static Value ResultType(ScalarFunctionCatalogEntry &entry, idx_t offset) {
		return FunctionStabilityToValue(entry.functions.GetFunctionByOffset(offset).stability);
	}